

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptDefaultParameterDeclaration
          (HlslGrammar *this,TType *type,TIntermTyped **node)

{
  HlslParseContext *this_00;
  _func_int **pp_Var1;
  TIntermediate *this_01;
  bool bVar2;
  int iVar3;
  long *plVar4;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar5;
  size_type sVar6;
  reference ppTVar7;
  undefined4 extraout_var;
  TIntermTyped *pTVar8;
  long lVar9;
  TIntermAggregate *aggrNode;
  TIntermTyped *origNode;
  TIntermTyped *pTStack_38;
  int i;
  TIntermTyped *arguments;
  TFunction *constructor;
  TIntermTyped **node_local;
  TType *type_local;
  HlslGrammar *this_local;
  
  *node = (TIntermTyped *)0x0;
  constructor = (TFunction *)node;
  node_local = (TIntermTyped **)type;
  type_local = (TType *)this;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
  if (!bVar2) {
    return true;
  }
  bVar2 = acceptConditionalExpression(this,(TIntermTyped **)constructor);
  if (!bVar2) {
    bVar2 = acceptInitializer(this,(TIntermTyped **)constructor);
    if (!bVar2) {
      return false;
    }
    arguments = (TIntermTyped *)
                HlslParseContext::makeConstructorCall
                          (this->parseContext,&(this->super_HlslTokenStream).token.loc,
                           (TType *)node_local);
    if ((TFunction *)arguments == (TFunction *)0x0) {
      return false;
    }
    pTStack_38 = (TIntermTyped *)0x0;
    origNode._4_4_ = 0;
    while( true ) {
      plVar4 = (long *)(**(code **)(*(constructor->super_TSymbol)._vptr_TSymbol + 0x30))();
      pvVar5 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (**(code **)(*plVar4 + 400))();
      sVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar5);
      pTVar8 = arguments;
      if ((int)sVar6 <= origNode._4_4_) break;
      this_00 = this->parseContext;
      plVar4 = (long *)(**(code **)(*(constructor->super_TSymbol)._vptr_TSymbol + 0x30))();
      pvVar5 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (**(code **)(*plVar4 + 400))();
      ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          (pvVar5,(long)origNode._4_4_);
      iVar3 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
      HlslParseContext::handleFunctionArgument
                (this_00,(TFunction *)pTVar8,&stack0xffffffffffffffc8,
                 (TIntermTyped *)CONCAT44(extraout_var,iVar3));
      origNode._4_4_ = origNode._4_4_ + 1;
    }
    pTVar8 = HlslParseContext::handleFunctionCall
                       (this->parseContext,&(this->super_HlslTokenStream).token.loc,
                        (TFunction *)arguments,
                        (TIntermTyped *)(constructor->super_TSymbol)._vptr_TSymbol);
    (constructor->super_TSymbol)._vptr_TSymbol = (_func_int **)pTVar8;
  }
  if ((constructor->super_TSymbol)._vptr_TSymbol == (_func_int **)0x0) {
    this_local._7_1_ = false;
  }
  else {
    lVar9 = (**(code **)(*(constructor->super_TSymbol)._vptr_TSymbol + 0x28))();
    if (lVar9 == 0) {
      pp_Var1 = (constructor->super_TSymbol)._vptr_TSymbol;
      this_01 = this->intermediate;
      aggrNode = (TIntermAggregate *)
                 (**(code **)(*(constructor->super_TSymbol)._vptr_TSymbol + 0x30))();
      pTVar8 = TIntermediate::fold(this_01,aggrNode);
      (constructor->super_TSymbol)._vptr_TSymbol = (_func_int **)pTVar8;
      if (((constructor->super_TSymbol)._vptr_TSymbol == (_func_int **)0x0) ||
         (pp_Var1 == (constructor->super_TSymbol)._vptr_TSymbol)) {
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,
                  "invalid default parameter value","");
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptDefaultParameterDeclaration(const TType& type, TIntermTyped*& node)
{
    node = nullptr;

    // Valid not to have a default_parameter_declaration
    if (!acceptTokenClass(EHTokAssign))
        return true;

    if (!acceptConditionalExpression(node)) {
        if (!acceptInitializer(node))
            return false;

        // For initializer lists, we have to const-fold into a constructor for the type, so build
        // that.
        TFunction* constructor = parseContext.makeConstructorCall(token.loc, type);
        if (constructor == nullptr)  // cannot construct
            return false;

        TIntermTyped* arguments = nullptr;
        for (int i = 0; i < int(node->getAsAggregate()->getSequence().size()); i++)
            parseContext.handleFunctionArgument(constructor, arguments, node->getAsAggregate()->getSequence()[i]->getAsTyped());

        node = parseContext.handleFunctionCall(token.loc, constructor, node);
    }

    if (node == nullptr)
        return false;

    // If this is simply a constant, we can use it directly.
    if (node->getAsConstantUnion())
        return true;

    // Otherwise, it has to be const-foldable.
    TIntermTyped* origNode = node;

    node = intermediate.fold(node->getAsAggregate());

    if (node != nullptr && origNode != node)
        return true;

    parseContext.error(token.loc, "invalid default parameter value", "", "");

    return false;
}